

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall
TimerHeap::addTimer(TimerHeap *this,int id,long timeout_ms,timeoutCallBack *callBack)

{
  timeType_ timeout_00;
  bool bVar1;
  Timer *this_00;
  size_type sVar2;
  mapped_type *this_01;
  reference __a;
  element_type *peVar3;
  timeType_ local_d0;
  undefined1 local_b9;
  function<void_()> local_b8;
  long local_98;
  long lStack_90;
  undefined1 local_88 [8];
  TimerPtr timer;
  undefined1 local_68 [8];
  TimerPtr tmp;
  _Node_iterator_base<std::pair<const_int,_std::weak_ptr<Timer>_>,_false> local_50;
  long lStack_48;
  timeType_ timeout;
  timespec tv;
  timeoutCallBack *callBack_local;
  long timeout_ms_local;
  TimerHeap *pTStack_10;
  int id_local;
  TimerHeap *this_local;
  
  timeout_ms_local._4_4_ = id;
  pTStack_10 = this;
  if ((this->timeFlag_ & 1U) != 0) {
    clock_gettime(1,(timespec *)&timeout.msec);
    (this->timeCache_).sec = timeout.msec;
    (this->timeCache_).msec = tv.tv_sec / 1000000;
    this->timeFlag_ = false;
  }
  lStack_48 = ((this->timeCache_).msec + timeout_ms) / 1000 + (this->timeCache_).sec;
  timeout.sec = ((this->timeCache_).msec + timeout_ms) % 1000;
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::weak_ptr<Timer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>_>
       ::find(&this->timerMap_,(key_type *)((long)&timeout_ms_local + 4));
  tmp.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       unordered_map<int,_std::weak_ptr<Timer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>_>
       ::end(&this->timerMap_);
  bVar1 = std::__detail::operator!=
                    (&local_50,
                     (_Node_iterator_base<std::pair<const_int,_std::weak_ptr<Timer>_>,_false> *)
                     &tmp.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (bVar1) {
    std::
    unordered_map<int,_std::weak_ptr<Timer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>_>
    ::operator[](&this->timerMap_,(key_type *)((long)&timeout_ms_local + 4));
    std::weak_ptr<Timer>::lock((weak_ptr<Timer> *)local_68);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
    if ((bVar1) &&
       (peVar3 = std::__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            local_68), peVar3->heapIndex_ != -1)) {
      peVar3 = std::__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_68);
      (peVar3->timeout_).sec = lStack_48;
      (peVar3->timeout_).msec = timeout.sec;
      peVar3 = std::__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_68);
      std::function<void_()>::operator=(&peVar3->callBack_,callBack);
      peVar3 = std::__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_68);
      modify(this,(long)peVar3->heapIndex_);
      timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
    }
    else {
      timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
    }
    std::shared_ptr<Timer>::~shared_ptr((shared_ptr<Timer> *)local_68);
    if ((int)timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi != 0) {
      return;
    }
  }
  this_00 = (Timer *)operator_new(0x38);
  local_b9 = 1;
  local_98 = lStack_48;
  lStack_90 = timeout.sec;
  std::function<void_()>::function(&local_b8,callBack);
  sVar2 = std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::size
                    (&this->timerHeap_);
  timeout_00.msec = lStack_90;
  timeout_00.sec = local_98;
  Timer::Timer(this_00,timeout_00,&local_b8,(int)sVar2);
  local_b9 = 0;
  std::shared_ptr<Timer>::shared_ptr<Timer,void>((shared_ptr<Timer> *)local_88,this_00);
  std::function<void_()>::~function(&local_b8);
  this_01 = std::
            unordered_map<int,_std::weak_ptr<Timer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>_>
            ::operator[](&this->timerMap_,(key_type *)((long)&timeout_ms_local + 4));
  std::weak_ptr<Timer>::operator=(this_01,(shared_ptr<Timer> *)local_88);
  std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::push_back
            (&this->timerHeap_,(shared_ptr<Timer> *)local_88);
  sVar2 = std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::size
                    (&this->timerHeap_);
  upHeap(this,sVar2 - 1);
  __a = std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::front
                  (&this->timerHeap_);
  bVar1 = std::operator==(__a,(shared_ptr<Timer> *)local_88);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_88);
    local_d0 = Timer::getTimeout(peVar3);
    setTime(this,&this->timeCache_,&local_d0);
  }
  std::shared_ptr<Timer>::~shared_ptr((shared_ptr<Timer> *)local_88);
  return;
}

Assistant:

void TimerHeap::addTimer(int id, long timeout_ms, timeoutCallBack callBack) {
    if (timeFlag_) {
        struct timespec tv;
        clock_gettime(CLOCK_MONOTONIC, &tv);
        timeCache_.sec = tv.tv_sec;
        timeCache_.msec = tv.tv_nsec / 1000 / 1000;
        timeFlag_ = false;
    }
    Timer::timeType_ timeout(timeCache_);
    timeout.sec += (timeCache_.msec + timeout_ms) / 1000;
    timeout.msec = (timeCache_.msec + timeout_ms) % 1000;
    if (timerMap_.find(id) != timerMap_.end()) {
        TimerPtr tmp(timerMap_[id].lock());
        if (tmp && tmp->heapIndex_ != -1) {
            tmp->timeout_ = std::move(timeout);
            tmp->callBack_ = std::move(callBack);
            modify(tmp->heapIndex_);
            return;
        }
    }
    TimerPtr timer(new Timer(std::move(timeout), std::move(callBack), timerHeap_.size()));
    timerMap_[id] = timer;
    timerHeap_.push_back(timer);
    upHeap(timerHeap_.size() - 1);
    if (timerHeap_.front() == timer) { 
        setTime(timeCache_, timer->getTimeout());
    }
}